

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriCommon.c
# Opt level: O0

uchar uriHexdigToIntW(wchar_t hexdig)

{
  char cVar1;
  undefined1 local_9;
  wchar_t hexdig_local;
  
  cVar1 = (char)hexdig;
  if ((uint)(hexdig + L'\xffffffd0') < 10) {
    local_9 = cVar1 + 0xd0;
  }
  else if ((uint)(hexdig + L'\xffffffbf') < 6) {
    local_9 = cVar1 + 0xc9;
  }
  else if ((uint)(hexdig + L'\xffffff9f') < 6) {
    local_9 = cVar1 + 0xa9;
  }
  else {
    local_9 = '\0';
  }
  return local_9;
}

Assistant:

unsigned char URI_FUNC(HexdigToInt)(URI_CHAR hexdig) {
	switch (hexdig) {
	case _UT('0'):
	case _UT('1'):
	case _UT('2'):
	case _UT('3'):
	case _UT('4'):
	case _UT('5'):
	case _UT('6'):
	case _UT('7'):
	case _UT('8'):
	case _UT('9'):
		return (unsigned char)(9 + hexdig - _UT('9'));

	case _UT('a'):
	case _UT('b'):
	case _UT('c'):
	case _UT('d'):
	case _UT('e'):
	case _UT('f'):
		return (unsigned char)(15 + hexdig - _UT('f'));

	case _UT('A'):
	case _UT('B'):
	case _UT('C'):
	case _UT('D'):
	case _UT('E'):
	case _UT('F'):
		return (unsigned char)(15 + hexdig - _UT('F'));

	default:
		return 0;
	}
}